

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

void SUNMatDestroy_Band(SUNMatrix A)

{
  long *in_RDI;
  
  if (in_RDI != (long *)0x0) {
    if (*in_RDI != 0) {
      if (*(long *)(*in_RDI + 0x30) != 0) {
        free(*(void **)(*in_RDI + 0x30));
        *(undefined8 *)(*in_RDI + 0x30) = 0;
      }
      if (*(long *)(*in_RDI + 0x40) != 0) {
        free(*(void **)(*in_RDI + 0x40));
        *(undefined8 *)(*in_RDI + 0x40) = 0;
      }
      free((void *)*in_RDI);
      *in_RDI = 0;
    }
    if (in_RDI[1] != 0) {
      free((void *)in_RDI[1]);
      in_RDI[1] = 0;
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void SUNMatDestroy_Band(SUNMatrix A)
{
  if (A == NULL) { return; }

  /* free content */
  if (A->content != NULL)
  {
    /* free data array */
    if (SM_DATA_B(A))
    {
      free(SM_DATA_B(A));
      SM_DATA_B(A) = NULL;
    }
    /* free column pointers */
    if (SM_COLS_B(A))
    {
      free(SM_COLS_B(A));
      SM_COLS_B(A) = NULL;
    }
    /* free content struct */
    free(A->content);
    A->content = NULL;
  }

  /* free ops and matrix */
  if (A->ops)
  {
    free(A->ops);
    A->ops = NULL;
  }
  free(A);
  A = NULL;

  return;
}